

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitCallRef(OptimizeInstructions *this,CallRef *curr)

{
  Expression **input;
  Expression *pEVar1;
  Expression *target;
  PassRunner *pPVar2;
  pointer puVar3;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> value;
  Function *this_00;
  Expression table;
  undefined1 auVar4 [16];
  OptimizeInstructions *this_01;
  Builder BVar5;
  Module *pMVar6;
  bool bVar7;
  Index index;
  CallIndirect *rep;
  HeapType HVar8;
  Expression **ppEVar9;
  HeapType HVar10;
  Type TVar11;
  Module *pMVar12;
  Drop *pDVar13;
  LocalGet *get;
  Block *pBVar14;
  Call *right;
  Type in_R8;
  pointer *ppuVar15;
  Module *pMVar16;
  initializer_list<wasm::Expression_*> local_b8;
  undefined1 local_a8 [56];
  OptimizeInstructions *local_70;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Builder local_48;
  Builder builder;
  
  input = &curr->target;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar7 = trapOnNull(this,(Expression *)curr,input);
  if (bVar7) {
    return;
  }
  pEVar1 = *input;
  if ((pEVar1->type).id == 1) {
    return;
  }
  if (pEVar1->_id == RefFuncId) {
    local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currModule;
    rep = (CallIndirect *)
          Builder::makeCall<ArenaVector<wasm::Expression*>>
                    ((Builder *)&local_68,(Name)pEVar1[1],&curr->operands,
                     (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)56>).
                           super_Expression.type.id,curr->isReturn);
  }
  else {
    pEVar1 = *input;
    builder.wasm = (Module *)curr;
    if (pEVar1->_id == TableGetId) {
      local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .currModule;
      table = pEVar1[1];
      target = *(Expression **)(pEVar1 + 2);
      HVar8 = wasm::Type::getHeapType(&pEVar1->type);
      rep = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                      ((Builder *)&local_68,(Name)table,target,&curr->operands,HVar8,curr->isReturn)
      ;
    }
    else {
      pPVar2 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).super_Pass.runner;
      pMVar12 = (this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .
                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .currModule;
      local_a8._52_4_ = (pMVar12->features).features;
      pMVar6 = (Module *)*input;
      local_70 = this;
      do {
        pMVar16 = pMVar6;
        local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)pMVar16;
        ppEVar9 = Properties::getImmediateFallthroughPtr
                            ((Expression **)&local_68,&pPVar2->options,pMVar12,AllowTeeBrIf);
        this = local_70;
        pMVar6 = (Module *)*ppEVar9;
      } while ((Module *)*ppEVar9 != pMVar16);
      if (*(Id *)&(pMVar16->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == RefFuncId) {
        HVar8 = wasm::Type::getHeapType(&(*input)->type);
        HVar10 = wasm::Type::getHeapType
                           ((Type *)&(pMVar16->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
        BVar5 = builder;
        this_01 = local_70;
        if (HVar8.id != HVar10.id) {
          return;
        }
        local_48.wasm =
             (local_70->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
        puVar3 = ((builder.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (puVar3 == (pointer)0x0) {
          pDVar13 = Builder::makeDrop(&local_48,
                                      (Expression *)
                                      ((builder.wasm)->globals).
                                      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          right = Builder::makeCall(&local_48,
                                    (IString)*(IString *)
                                              &(pMVar16->exports).
                                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_68,
                                    (Type)((BVar5.wasm)->exports).
                                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                    *(bool *)&((BVar5.wasm)->globals).
                                              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish);
          pBVar14 = Builder::makeSequence(&local_48,(Expression *)pDVar13,(Expression *)right);
          replaceCurrent(this_01,(Expression *)pBVar14);
          if (local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            return;
          }
          operator_delete(local_68.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          return;
        }
        ppuVar15 = &((builder.wasm)->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        value.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
             (*ppuVar15)
             [(long)((long)&puVar3[-1]._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t + 7)]._M_t.
             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
        TVar11.id = ((Type *)((long)value.
                                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8))
                    ->id;
        if (TVar11.id == 1) {
          return;
        }
        bVar7 = TypeUpdating::canHandleAsLocal(TVar11);
        if (!bVar7) {
          return;
        }
        this_00 = (this_01->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currFunction;
        local_a8._32_8_ = TVar11.id;
        local_a8._40_8_ = ppuVar15;
        TVar11 = TypeUpdating::getValidLocalType(TVar11,(FeatureSet)local_a8._52_4_);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = TVar11.id;
        index = Builder::addVar((Builder *)this_00,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
        pMVar12 = (Module *)
                  Builder::makeLocalSet
                            (&local_48,index,
                             (Expression *)
                             value.
                             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                             .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        pDVar13 = Builder::makeDrop(&local_48,
                                    (Expression *)
                                    ((builder.wasm)->globals).
                                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        get = (LocalGet *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
        this = local_70;
        (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id = LocalGetId;
        get->index = index;
        (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             local_a8._32_8_;
        local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pointer)TypeUpdating::fixLocalGet
                                (get,(local_70->
                                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                     ).
                                     super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                     .
                                     super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                     .currModule);
        BVar5 = builder;
        local_b8._M_len = 3;
        local_b8._M_array = (iterator)&local_68;
        local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)pMVar12;
        local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)pDVar13;
        pBVar14 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                            (&local_48,&local_b8);
        puVar3 = ((BVar5.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (puVar3 == (pointer)0x0) {
          __assert_fail("usedElements > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xd0,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        ((BVar5.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage
        [(long)((long)&puVar3[-1]._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t + 7)]._M_t.
        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = (Export *)pBVar14;
        rep = (CallIndirect *)
              Builder::makeCall<ArenaVector<wasm::Expression*>>
                        (&local_48,
                         (IString)*(IString *)
                                   &(pMVar16->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (ArenaVector<wasm::Expression_*> *)local_a8._40_8_,
                         (Type)((BVar5.wasm)->exports).
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                         *(bool *)&((BVar5.wasm)->globals).
                                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        local_a8._0_8_ = 0;
        local_a8._8_8_ = 0;
        local_a8._24_8_ =
             std::
             _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp:1393:11)>
             ::_M_invoke;
        local_a8._16_8_ =
             std::
             _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp:1393:11)>
             ::_M_manager;
        rep = (CallIndirect *)
              CallUtils::convertToDirectCalls<wasm::CallRef>
                        ((CallUtils *)builder.wasm,(CallRef *)local_a8,
                         (function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
                          *)(local_70->
                            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                            ).
                            super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .
                            super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                            .currFunction,
                         (Function *)
                         (local_70->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currModule,(Module *)in_R8.id);
        if ((Expression **)local_a8._16_8_ != (Expression **)0x0) {
          (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
        }
        if (rep == (CallIndirect *)0x0) {
          return;
        }
      }
    }
  }
  replaceCurrent(this,(Expression *)rep);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    skipNonNullCast(curr->target, curr);
    if (trapOnNull(curr, curr->target)) {
      return;
    }
    if (curr->target->type == Type::unreachable) {
      // The call_ref is not reached; leave this for DCE.
      return;
    }

    if (auto* ref = curr->target->dynCast<RefFunc>()) {
      // We know the target!
      replaceCurrent(
        Builder(*getModule())
          .makeCall(ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    if (auto* get = curr->target->dynCast<TableGet>()) {
      // (call_ref ..args.. (table.get $table (index))
      //   =>
      // (call_indirect $table ..args.. (index))
      replaceCurrent(Builder(*getModule())
                       .makeCallIndirect(get->table,
                                         get->index,
                                         curr->operands,
                                         get->type.getHeapType(),
                                         curr->isReturn));
      return;
    }

    auto features = getModule()->features;

    // It is possible the target is not a function reference, but we can infer
    // the fallthrough value there. It takes more work to optimize this case,
    // but it is pretty important to allow a call_ref to become a fast direct
    // call, so make the effort.
    if (auto* ref = Properties::getFallthrough(
                      curr->target, getPassOptions(), *getModule())
                      ->dynCast<RefFunc>()) {
      // Check if the fallthrough make sense. We may have cast it to a different
      // type, which would be a problem - we'd be replacing a call_ref to one
      // type with a direct call to a function of another type. That would trap
      // at runtime; be careful not to emit invalid IR here.
      if (curr->target->type.getHeapType() != ref->type.getHeapType()) {
        return;
      }
      Builder builder(*getModule());
      if (curr->operands.empty()) {
        // No operands, so this is simple and there is nothing to reorder: just
        // emit:
        //
        // (block
        //  (drop curr->target)
        //  (call ref.func-from-curr->target)
        // )
        replaceCurrent(builder.makeSequence(
          builder.makeDrop(curr->target),
          builder.makeCall(ref->func, {}, curr->type, curr->isReturn)));
        return;
      }

      // In the presence of operands, we must execute the code in curr->target
      // after the last operand and before the call happens. Interpose at the
      // last operand:
      //
      // (call ref.func-from-curr->target)
      //  (operand1)
      //  (..)
      //  (operandN-1)
      //  (block
      //   (local.set $temp (operandN))
      //   (drop curr->target)
      //   (local.get $temp)
      //  )
      // )
      auto* lastOperand = curr->operands.back();
      auto lastOperandType = lastOperand->type;
      if (lastOperandType == Type::unreachable) {
        // The call_ref is not reached; leave this for DCE.
        return;
      }
      if (!TypeUpdating::canHandleAsLocal(lastOperandType)) {
        // We cannot create a local, so we must give up.
        return;
      }
      Index tempLocal = builder.addVar(
        getFunction(),
        TypeUpdating::getValidLocalType(lastOperandType, features));
      auto* set = builder.makeLocalSet(tempLocal, lastOperand);
      auto* drop = builder.makeDrop(curr->target);
      auto* get = TypeUpdating::fixLocalGet(
        builder.makeLocalGet(tempLocal, lastOperandType), *getModule());
      curr->operands.back() = builder.makeBlock({set, drop, get});
      replaceCurrent(builder.makeCall(
        ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    // If the target is a select of two different constants, we can emit an if
    // over two direct calls.
    if (auto* calls = CallUtils::convertToDirectCalls(
          curr,
          [](Expression* target) -> CallUtils::IndirectCallInfo {
            if (auto* refFunc = target->dynCast<RefFunc>()) {
              return CallUtils::Known{refFunc->func};
            }
            return CallUtils::Unknown{};
          },
          *getFunction(),
          *getModule())) {
      replaceCurrent(calls);
    }
  }